

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::DiagScopeVariablesWalker::DiagScopeVariablesWalker
          (DiagScopeVariablesWalker *this,DiagStackFrame *_pFrame,Var _instance,
          IDiagObjectModelWalkerBase *innerWalker)

{
  int iVar1;
  uint32 uVar2;
  undefined4 extraout_var;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  
  (this->super_VariableWalkerBase).pFrame = _pFrame;
  (this->super_VariableWalkerBase).instance = _instance;
  (this->super_VariableWalkerBase).pMembersList =
       (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->super_VariableWalkerBase).groupType = UIGroupType_InnerScope;
  (this->super_VariableWalkerBase).allowLexicalThis = false;
  (this->super_VariableWalkerBase).allowSuperReference = false;
  (this->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase
       = (_func_int **)&PTR_Get_014e20e0;
  this->pDiagScopeObjects =
       (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  *(undefined8 *)((long)&this->pDiagScopeObjects + 6) = 0;
  iVar1 = (*_pFrame->_vptr_DiagStackFrame[10])(_pFrame);
  alloc = GetArenaFromContext((ScriptContext *)CONCAT44(extraout_var,iVar1));
  this_00 = (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (this_00->
  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (this_00->
  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e43c8;
  (this_00->
  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (this_00->
  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  this_00->length = 0;
  this_00->increment = 4;
  this->pDiagScopeObjects = this_00;
  JsUtil::
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_00,0);
  iVar1 = (this_00->
          super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  (this_00->
  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer[iVar1] = innerWalker;
  (this_00->
  super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = iVar1 + 1;
  uVar2 = (*innerWalker->_vptr_IDiagObjectModelWalkerBase[1])(innerWalker);
  this->diagScopeVarCount = uVar2;
  this->scopeIsInitialized = true;
  return;
}

Assistant:

DiagScopeVariablesWalker::DiagScopeVariablesWalker(DiagStackFrame* _pFrame, Var _instance, IDiagObjectModelWalkerBase* innerWalker)
        : VariableWalkerBase(_pFrame, _instance, UIGroupType_InnerScope, /* allowLexicalThis */ false),
        pDiagScopeObjects(nullptr),
        diagScopeVarCount(0),
        scopeIsInitialized(false), // false until end of method
        enumWithScopeAlso(false)
    {
        ScriptContext * scriptContext = _pFrame->GetScriptContext();
        ArenaAllocator *arena = GetArenaFromContext(scriptContext);
        pDiagScopeObjects = JsUtil::List<IDiagObjectModelWalkerBase *, ArenaAllocator>::New(arena);
        pDiagScopeObjects->Add(innerWalker);
        diagScopeVarCount = innerWalker->GetChildrenCount();
        scopeIsInitialized = true;
    }